

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O1

int VP8LBackwardReferencesTraceBackwards
              (int xsize,int ysize,uint32_t *argb,int cache_bits,VP8LHashChain *hash_chain,
              VP8LBackwardRefs *refs_src,VP8LBackwardRefs *refs_dst)

{
  ushort uVar1;
  uint32_t *puVar2;
  int64_t *piVar3;
  CostInterval *pCVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  uint uVar9;
  CostCacheInterval *cur;
  ushort *ptr;
  uint32_t *output;
  CostManager *manager;
  VP8LHistogram *h;
  CostCacheInterval *pCVar10;
  ulong *puVar11;
  ushort *puVar12;
  ulong uVar13;
  CostInterval *pCVar14;
  CostInterval *pCVar15;
  uint uVar16;
  CostInterval *pCVar17;
  uint uVar18;
  uint32_t uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  bool bVar23;
  uint uVar24;
  CostManager *pCVar25;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  uint uVar29;
  uint64_t nmemb;
  ushort *puVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  VP8LColorCache hashers;
  VP8LColorCache local_98;
  ulong local_88;
  int local_7c;
  CostInterval *local_78;
  uint64_t local_70;
  ushort *local_68;
  int local_5c;
  long local_58;
  VP8LBackwardRefs *local_50;
  VP8LHashChain *local_48;
  uint32_t *local_40;
  ulong local_38;
  
  local_88 = (ulong)(uint)(ysize * xsize);
  nmemb = (uint64_t)(ysize * xsize);
  local_7c = xsize;
  local_48 = hash_chain;
  ptr = (ushort *)WebPSafeMalloc(nmemb,2);
  if (ptr != (ushort *)0x0) {
    iVar7 = (1 << ((byte)cache_bits & 0x1f)) + 0x118;
    bVar5 = cache_bits < 1;
    if (cache_bits < 1) {
      iVar7 = 0x118;
    }
    local_50 = refs_src;
    output = (uint32_t *)WebPSafeCalloc(1,(long)iVar7 * 4 + 0xca8);
    manager = (CostManager *)WebPSafeCalloc(1,0x81c8);
    local_68 = ptr;
    if (manager == (CostManager *)0x0 || output == (uint32_t *)0x0) {
      iVar7 = 0;
LAB_0014c013:
      bVar23 = true;
    }
    else {
      *(uint32_t **)(output + 0x328) = output + 0x32a;
      if (cache_bits < 1) {
        iVar7 = 0;
      }
      else {
        iVar7 = VP8LColorCacheInit(&local_98,cache_bits);
        if (iVar7 == 0) {
          iVar7 = 0;
          goto LAB_0014c013;
        }
      }
      h = VP8LAllocateHistogram(cache_bits);
      if (h == (VP8LHistogram *)0x0) {
        VP8LFreeHistogram((VP8LHistogram *)0x0);
        goto LAB_0014c013;
      }
      local_70 = nmemb;
      VP8LHistogramInit(h,cache_bits,1);
      VP8LHistogramStoreRefs(local_50,VP8LDistanceToPlaneCode,local_7c,h);
      iVar8 = (1 << ((byte)h->palette_code_bits & 0x1f)) + 0x118;
      if (h->palette_code_bits < 1) {
        iVar8 = 0x118;
      }
      ConvertPopulationCountTableToBitEstimates(iVar8,h->literal,*(uint32_t **)(output + 0x328));
      ConvertPopulationCountTableToBitEstimates(0x100,h->red,output + 0x100);
      ConvertPopulationCountTableToBitEstimates(0x100,h->blue,output + 0x200);
      ConvertPopulationCountTableToBitEstimates(0x100,h->alpha,output);
      local_40 = output + 0x300;
      ConvertPopulationCountTableToBitEstimates(0x28,h->distance,local_40);
      VP8LFreeHistogram(h);
      nmemb = local_70;
      manager->costs = (int64_t *)0x0;
      manager->cache_intervals = (CostCacheInterval *)0x0;
      manager->head = (CostInterval *)0x0;
      manager->count = 0;
      manager->dist_array = ptr;
      manager->free_intervals = (CostInterval *)0x0;
      manager->recycled_intervals = (CostInterval *)0x0;
      local_78 = manager->intervals;
      pCVar14 = (CostInterval *)(manager->cost_cache + 0xffc);
      lVar20 = 10;
      pCVar17 = (CostInterval *)0x0;
      do {
        pCVar14[1].next = pCVar17;
        pCVar14 = pCVar14 + 1;
        lVar20 = lVar20 + -1;
        pCVar17 = pCVar14;
      } while (lVar20 != 0);
      iVar8 = (int)local_88;
      uVar28 = 0xfff;
      if (iVar8 < 0xfff) {
        uVar28 = local_88 & 0xffffffff;
      }
      manager->free_intervals = pCVar14;
      if (0 < iVar8) {
        lVar20 = *(long *)(output + 0x328);
        uVar21 = 0;
        do {
          if (uVar21 < 0x200) {
            uVar26 = (uint)kPrefixEncodeCode[uVar21].code;
            uVar24 = (uint)kPrefixEncodeCode[uVar21].extra_bits;
          }
          else {
            uVar18 = (int)uVar21 - 1;
            uVar26 = 0x1f;
            if (uVar18 != 0) {
              for (; uVar18 >> uVar26 == 0; uVar26 = uVar26 - 1) {
              }
            }
            uVar24 = 0x1e - (uVar26 ^ 0x1f);
            uVar26 = (uint)((uVar18 >> (uVar24 & 0x1f) & 1) != 0) + (uVar26 ^ 0x1f) * 2 ^ 0x3e;
          }
          manager->cost_cache[uVar21] =
               (long)(int)uVar24 * 0x800000 +
               (ulong)*(uint *)(lVar20 + 0x400 + (long)(int)uVar26 * 4);
          uVar21 = uVar21 + 1;
        } while (uVar28 != uVar21);
      }
      manager->cache_intervals_size = 1;
      if (1 < iVar8) {
        lVar20 = 0;
        do {
          if (manager->cost_cache[lVar20 + 1] != manager->cost_cache[lVar20]) {
            manager->cache_intervals_size = manager->cache_intervals_size + 1;
          }
          lVar20 = lVar20 + 1;
        } while (uVar28 - 1 != lVar20);
      }
      pCVar10 = (CostCacheInterval *)WebPSafeMalloc(manager->cache_intervals_size,0x10);
      manager->cache_intervals = pCVar10;
      if (pCVar10 == (CostCacheInterval *)0x0) {
LAB_0014bfee:
        CostManagerClear(manager);
        goto LAB_0014c013;
      }
      pCVar10->start = 0;
      pCVar10->end = 1;
      pCVar10->cost = manager->cost_cache[0];
      if (1 < iVar8) {
        lVar20 = 0;
        do {
          lVar22 = manager->cost_cache[lVar20 + 1];
          if (lVar22 != pCVar10->cost) {
            pCVar10[1].start = (int)lVar20 + 1;
            pCVar10[1].cost = lVar22;
            pCVar10 = pCVar10 + 1;
          }
          pCVar10->end = (int)lVar20 + 2;
          lVar20 = lVar20 + 1;
        } while (uVar28 - 1 != lVar20);
      }
      puVar11 = (ulong *)WebPSafeMalloc(nmemb,8);
      manager->costs = (int64_t *)puVar11;
      auVar6 = _DAT_001b3ac0;
      if (puVar11 == (ulong *)0x0) goto LAB_0014bfee;
      if (0 < iVar8) {
        lVar20 = nmemb - 1;
        auVar31._8_4_ = (int)lVar20;
        auVar31._0_8_ = lVar20;
        auVar31._12_4_ = (int)((ulong)lVar20 >> 0x20);
        uVar28 = 0;
        auVar31 = auVar31 ^ _DAT_001b3ac0;
        auVar32 = _DAT_001b2890;
        do {
          auVar33 = auVar32 ^ auVar6;
          if ((bool)(~(auVar33._4_4_ == auVar31._4_4_ && auVar31._0_4_ < auVar33._0_4_ ||
                      auVar31._4_4_ < auVar33._4_4_) & 1)) {
            puVar11[uVar28] = 0x7fffffffffffffff;
          }
          if ((auVar33._12_4_ != auVar31._12_4_ || auVar33._8_4_ <= auVar31._8_4_) &&
              auVar33._12_4_ <= auVar31._12_4_) {
            puVar11[uVar28 + 1] = 0x7fffffffffffffff;
          }
          uVar28 = uVar28 + 2;
          lVar20 = auVar32._8_8_;
          auVar32._0_8_ = auVar32._0_8_ + 2;
          auVar32._8_8_ = lVar20 + 2;
        } while ((iVar8 + 1U & 0xfffffffe) != uVar28);
      }
      *ptr = 0;
      uVar26 = *argb;
      if (cache_bits < 1) {
        uVar18 = 0xffffffff;
      }
      else {
        uVar18 = uVar26 * 0x1e35a7bd >> ((byte)local_98.hash_shift & 0x1f);
        if (local_98.colors[(int)uVar18] != uVar26) {
          uVar18 = 0xffffffff;
        }
      }
      if ((int)uVar18 < 0) {
        if (0 < cache_bits) {
          local_98.colors[(int)(uVar26 * 0x1e35a7bd >> ((byte)local_98.hash_shift & 0x1f))] = uVar26
          ;
        }
        lVar20 = ((ulong)output[(ulong)(uVar26 & 0xff) + 0x200] +
                  (ulong)*(uint *)(*(long *)(output + 0x328) + (ulong)(uVar26 >> 8 & 0xff) * 4) +
                 (ulong)*(uint *)((long)output + (ulong)(uVar26 >> 0xe & 0x3fc) + 0x400) +
                 (ulong)output[uVar26 >> 0x18]) * 0x52;
      }
      else {
        lVar20 = (ulong)*(uint *)(*(long *)(output + 0x328) + (long)(int)(uVar18 + 0x118) * 4) *
                 0x44;
      }
      uVar28 = (lVar20 + 0x32U) / 100;
      if ((long)uVar28 < (long)*puVar11) {
        *puVar11 = uVar28;
        *ptr = 1;
      }
      if (1 < iVar8) {
        local_58 = -1;
        uVar28 = 0;
        uVar13 = 1;
        iVar8 = -1;
        pCVar14 = local_78;
        uVar21 = 0xffffffff;
        uVar26 = 0xffffffff;
        do {
          uVar18 = argb[uVar13];
          uVar24 = 0xffffffff;
          if ((0 < cache_bits) &&
             (uVar24 = uVar18 * 0x1e35a7bd >> ((byte)local_98.hash_shift & 0x1f),
             local_98.colors[(int)uVar24] != uVar18)) {
            uVar24 = 0xffffffff;
          }
          puVar2 = local_48->offset_length;
          uVar29 = puVar2[uVar13];
          piVar3 = manager->costs;
          lVar20 = piVar3[uVar13 - 1];
          if ((int)uVar24 < 0) {
            if (0 < cache_bits) {
              local_98.colors[(int)(uVar18 * 0x1e35a7bd >> ((byte)local_98.hash_shift & 0x1f))] =
                   uVar18;
            }
            lVar22 = ((ulong)output[(ulong)(uVar18 & 0xff) + 0x200] +
                      (ulong)*(uint *)(*(long *)(output + 0x328) + (ulong)(uVar18 >> 8 & 0xff) * 4)
                     + (ulong)*(uint *)((long)output + (ulong)(uVar18 >> 0xe & 0x3fc) + 0x400) +
                       (ulong)output[uVar18 >> 0x18]) * 0x52;
            pCVar14 = local_78;
            local_88 = uVar28;
            local_5c = iVar8;
          }
          else {
            lVar22 = (ulong)*(uint *)(*(long *)(output + 0x328) + (long)(int)(uVar24 + 0x118) * 4) *
                     0x44;
          }
          lVar22 = (lVar22 + 0x32U) / 100 + lVar20;
          if (lVar22 < piVar3[uVar13]) {
            piVar3[uVar13] = lVar22;
            local_68[uVar13] = 1;
          }
          uVar24 = uVar29 >> 0xc;
          uVar29 = uVar29 & 0xfff;
          uVar18 = (uint)uVar13;
          local_38 = uVar21;
          if (1 < uVar29) {
            if (uVar24 == uVar26) {
              uVar28 = uVar28 & 0xffffffff;
              if (iVar8 != 0) {
                uVar28 = (ulong)((uVar18 - 2) + (int)uVar21);
              }
              iVar8 = 0;
              iVar27 = (int)uVar28;
              if (iVar27 < (int)(uVar18 + uVar29 + -1)) {
                uVar26 = 0;
                uVar28 = uVar13;
                if ((long)uVar13 <= (long)iVar27) {
                  do {
                    lVar20 = uVar28 + 1;
                    if (puVar2[lVar20] >> 0xc != uVar24) {
                      uVar26 = puVar2[uVar28 & 0xffffffff] & 0xfff;
                      uVar18 = (uint)uVar28;
                      goto LAB_0014c590;
                    }
                    bVar23 = (long)uVar28 < (long)iVar27;
                    uVar28 = uVar28 + 1;
                  } while (bVar23);
                  uVar26 = puVar2[lVar20] & 0xfff;
                  uVar18 = iVar27 + 1;
                }
LAB_0014c590:
                pCVar14 = manager->head;
                local_88 = (ulong)(int)(uVar18 - 1);
                pCVar17 = pCVar14;
                if (pCVar14 != (CostInterval *)0x0) {
                  do {
                    if ((int)uVar18 <= pCVar17->start) break;
                    pCVar15 = pCVar17->next;
                    if (((int)uVar18 <= pCVar17->end) && (pCVar17->cost < piVar3[local_88])) {
                      iVar8 = pCVar17->index;
                      piVar3[local_88] = pCVar17->cost;
                      manager->dist_array[local_88] = ((short)(uVar18 - 1) - (short)iVar8) + 1;
                    }
                    pCVar17 = pCVar15;
                  } while (pCVar15 != (CostInterval *)0x0);
                  do {
                    if ((int)uVar18 < pCVar14->start) break;
                    pCVar17 = pCVar14->next;
                    if (((int)uVar18 < pCVar14->end) && (pCVar14->cost < piVar3[uVar18])) {
                      iVar8 = pCVar14->index;
                      piVar3[uVar18] = pCVar14->cost;
                      manager->dist_array[uVar18] = ((short)uVar18 - (short)iVar8) + 1;
                    }
                    pCVar14 = pCVar17;
                  } while (pCVar17 != (CostInterval *)0x0);
                }
                PushInterval(manager,piVar3[local_88] + local_58,uVar18,uVar26);
                iVar8 = 0;
                pCVar14 = local_78;
                uVar28 = (ulong)((int)local_88 + uVar26);
              }
            }
            else {
              local_88 = uVar28;
              iVar8 = VP8LDistanceToPlaneCode(local_7c,uVar24);
              if (iVar8 < 0x200) {
                uVar26 = (uint)kPrefixEncodeCode[iVar8].code;
                uVar16 = (uint)kPrefixEncodeCode[iVar8].extra_bits;
              }
              else {
                uVar9 = iVar8 - 1;
                uVar26 = 0x1f;
                if (uVar9 != 0) {
                  for (; uVar9 >> uVar26 == 0; uVar26 = uVar26 - 1) {
                  }
                }
                uVar16 = 0x1e - (uVar26 ^ 0x1f);
                uVar26 = (uint)((uVar9 >> (uVar16 & 0x1f) & 1) != 0) + (uVar26 ^ 0x1f) * 2 ^ 0x3e;
              }
              local_58 = (long)(int)uVar16 * 0x800000 + (ulong)local_40[(int)uVar26];
              PushInterval(manager,lVar20 + local_58,uVar18,uVar29);
              iVar8 = 1;
              pCVar14 = local_78;
              uVar28 = local_88;
            }
          }
          pCVar17 = manager->head;
          while ((pCVar15 = pCVar17, pCVar15 != (CostInterval *)0x0 &&
                 ((long)pCVar15->start <= (long)uVar13))) {
            pCVar17 = pCVar15->next;
            if ((long)uVar13 < (long)pCVar15->end) {
              if (pCVar15->cost < manager->costs[uVar13]) {
                iVar27 = pCVar15->index;
                manager->costs[uVar13] = pCVar15->cost;
                manager->dist_array[uVar13] = ((short)uVar13 - (short)iVar27) + 1;
              }
            }
            else {
              pCVar4 = pCVar15->previous;
              pCVar25 = (CostManager *)&pCVar4->next;
              if (pCVar4 == (CostInterval *)0x0) {
                pCVar25 = manager;
              }
              pCVar25->head = pCVar17;
              if (pCVar17 != (CostInterval *)0x0) {
                pCVar17->previous = pCVar4;
              }
              bVar23 = manager->intervals + 9 < pCVar15 || pCVar15 < pCVar14;
              pCVar15->next = (&manager->free_intervals)[bVar23];
              (&manager->free_intervals)[bVar23] = pCVar15;
              manager->count = manager->count + -1;
            }
          }
          uVar13 = uVar13 + 1;
          uVar21 = (ulong)uVar29;
          uVar26 = uVar24;
        } while (uVar13 != local_70);
      }
      bVar23 = local_50->error != 0;
      ptr = local_68;
      nmemb = local_70;
    }
    if (iVar7 != 0) {
      VP8LColorCacheClear(&local_98);
    }
    CostManagerClear(manager);
    WebPSafeFree(output);
    WebPSafeFree(manager);
    if (!bVar23) {
      puVar30 = ptr + nmemb;
      for (puVar12 = ptr + (nmemb - 1); ptr <= puVar12;
          puVar12 = (ushort *)((long)puVar12 - (ulong)((uint)uVar1 * 2))) {
        uVar1 = *puVar12;
        puVar30[-1] = uVar1;
        puVar30 = puVar30 + -1;
      }
      if ((cache_bits < 1) || (iVar7 = VP8LColorCacheInit(&local_98,cache_bits), iVar7 != 0)) {
        VP8LClearBackwardRefs(refs_dst);
        uVar26 = (uint)((ulong)((long)(ptr + nmemb) - (long)puVar30) >> 1);
        if (0 < (int)uVar26) {
          uVar28 = 0;
          uVar21 = 0;
          do {
            uVar1 = puVar30[uVar28];
            uVar18 = (uint)uVar1;
            if ((ulong)uVar1 == 1) {
              if (cache_bits < 1) {
                uVar19 = 0xffffffff;
              }
              else {
                uVar19 = argb[uVar21] * 0x1e35a7bd >> ((byte)local_98.hash_shift & 0x1f);
                if (local_98.colors[(int)uVar19] != argb[uVar21]) {
                  uVar19 = 0xffffffff;
                }
              }
              uVar13 = 0x10001;
              if ((int)uVar19 < 0) {
                if (0 < cache_bits) {
                  local_98.colors
                  [(int)(argb[uVar21] * 0x1e35a7bd >> ((byte)local_98.hash_shift & 0x1f))] =
                       argb[uVar21];
                }
                uVar19 = argb[uVar21];
                uVar13 = 0x10000;
              }
              VP8LBackwardRefsCursorAdd(refs_dst,(PixOrCopy)((ulong)uVar19 << 0x20 | uVar13));
              uVar18 = 1;
            }
            else {
              VP8LBackwardRefsCursorAdd
                        (refs_dst,(PixOrCopy)
                                  (((ulong)(local_48->offset_length[uVar21] >> 0xc) << 0x20) +
                                   (ulong)uVar1 * 0x10000 + 2));
              if ((0 < cache_bits) && (uVar1 != 0)) {
                uVar13 = 0;
                do {
                  local_98.colors
                  [(int)(argb[uVar21 + uVar13] * 0x1e35a7bd >> ((byte)local_98.hash_shift & 0x1f))]
                       = argb[uVar21 + uVar13];
                  uVar13 = uVar13 + 1;
                } while (uVar1 != uVar13);
              }
            }
            uVar21 = (ulong)((int)uVar21 + uVar18);
            uVar28 = uVar28 + 1;
          } while (uVar28 != (uVar26 & 0x7fffffff));
        }
        uVar26 = (uint)(refs_dst->error == 0);
        ptr = local_68;
      }
      else {
        uVar26 = 0;
        bVar5 = true;
      }
      if (!bVar5) {
        VP8LColorCacheClear(&local_98);
      }
      goto LAB_0014c043;
    }
  }
  uVar26 = 0;
LAB_0014c043:
  WebPSafeFree(ptr);
  return uVar26;
}

Assistant:

int VP8LBackwardReferencesTraceBackwards(int xsize, int ysize,
                                         const uint32_t* const argb,
                                         int cache_bits,
                                         const VP8LHashChain* const hash_chain,
                                         const VP8LBackwardRefs* const refs_src,
                                         VP8LBackwardRefs* const refs_dst) {
  int ok = 0;
  const int dist_array_size = xsize * ysize;
  uint16_t* chosen_path = NULL;
  int chosen_path_size = 0;
  uint16_t* dist_array =
      (uint16_t*)WebPSafeMalloc(dist_array_size, sizeof(*dist_array));

  if (dist_array == NULL) goto Error;

  if (!BackwardReferencesHashChainDistanceOnly(
          xsize, ysize, argb, cache_bits, hash_chain, refs_src, dist_array)) {
    goto Error;
  }
  TraceBackwards(dist_array, dist_array_size, &chosen_path, &chosen_path_size);
  if (!BackwardReferencesHashChainFollowChosenPath(
          argb, cache_bits, chosen_path, chosen_path_size, hash_chain,
          refs_dst)) {
    goto Error;
  }
  ok = 1;
 Error:
  WebPSafeFree(dist_array);
  return ok;
}